

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O3

void dirSAVECDTCode(path *cdtname)

{
  aint aVar1;
  aint aVar2;
  undefined8 uVar3;
  bool bVar4;
  aint args [3];
  bool opt [3];
  void *local_50;
  string tfname;
  
  bVar4 = anyComma(&lp);
  if (bVar4) {
    GetDelimitedString_abi_cxx11_(&tfname,&lp);
    bVar4 = anyComma(&lp);
    if (bVar4) {
      args[2] = -1;
      args[0] = 0;
      args[1] = 0;
      opt[2] = true;
      opt[0] = false;
      opt[1] = false;
      bVar4 = getIntArguments<3>(&lp,&args,&opt);
      aVar1 = args[2];
      uVar3 = args._0_8_;
      aVar2 = args[0];
      if (args[1] + args[0] < 0x10001 &&
          (0xffff0000 < args[1] - 0x10000U && (-1 < args[0] && bVar4))) {
        CDTUtil::getContigRAM((CDTUtil *)&local_50,args[0],args[1]);
        if (aVar1 < 0) {
          aVar1 = aVar2;
        }
        CDTUtil::writeTapeFile
                  (cdtname,(string *)tfname._M_dataplus._M_p,(byte)tfname._M_string_length,
                   (byte *)0x2,(aint)local_50,SUB82(uVar3,4),(word)uVar3,(word)aVar1);
        if (local_50 != (void *)0x0) {
          operator_delete__(local_50);
        }
      }
      else {
        Error("[SAVECDT] Invalid args. SAVECDT CODE <cdtname>,<name>,<start>,<length>[,<customstartaddress>]"
              ,lp,SUPPRESS);
      }
    }
    else {
      Error("[SAVECDT] Invalid args. SAVECDT CODE <cdtname>,<name>,<start>,<length>[,<customstartaddress>]"
            ,lp,SUPPRESS);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tfname._M_dataplus._M_p != &tfname.field_2) {
      operator_delete(tfname._M_dataplus._M_p,tfname.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  Error("[SAVECDT] Invalid args. SAVECDT CODE <cdtname>,<name>,<start>,<length>[,<customstartaddress>]"
        ,lp,SUPPRESS);
  return;
}

Assistant:

static void dirSAVECDTCode(const std::filesystem::path & cdtname) {
	constexpr const char* argerr = "[SAVECDT] Invalid args. SAVECDT CODE <cdtname>,<name>,<start>,<length>[,<customstartaddress>]";

	if (!anyComma(lp)) {
		Error(argerr, lp, SUPPRESS); return;
	}

	const std::string tfname = GetDelimitedString(lp);
	if (!anyComma(lp)) {
		Error(argerr, lp, SUPPRESS); return;
	}

	aint args[] = { /*0:start*/ 0, /*1:length*/ 0, /*2:customStart*/ -1 };
	bool opt[] = { false, false, true };
	if (!getIntArguments<3>(lp, args, opt) || args[0] < 0 || args[1] < 1 || 0x10000 <= args[1] || 0x10000 < (args[0]+args[1])) {
		Error(argerr, lp, SUPPRESS); return;
	}

	SaveCDT_Code(cdtname, tfname, args[0], args[1], args[2]);
}